

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closefd.c
# Opt level: O0

void nn_closefd(int fd)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  int in_EDI;
  bool bVar5;
  int rc;
  int in_stack_ffffffffffffffdc;
  
  if ((-1 < in_EDI) && (iVar1 = close(in_EDI), iVar1 != 0)) {
    piVar2 = __errno_location();
    bVar5 = true;
    if (*piVar2 != 4) {
      piVar2 = __errno_location();
      bVar5 = true;
      if (*piVar2 != 0x6e) {
        piVar2 = __errno_location();
        bVar5 = true;
        if (*piVar2 != 0xb) {
          piVar2 = __errno_location();
          bVar5 = true;
          if (*piVar2 != 0x73) {
            piVar2 = __errno_location();
            bVar5 = *piVar2 == 0x68;
          }
        }
      }
    }
    if (!bVar5) {
      nn_backtrace_print();
      __stream = _stderr;
      __errno_location();
      pcVar3 = nn_err_strerror(in_stack_ffffffffffffffdc);
      puVar4 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/utils/closefd.c"
              ,0x2a);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

void nn_closefd (int fd)
{
    int rc;
    if (nn_slow (fd < 0)) {
        return;
    }
    rc = close (fd);
    if (nn_fast (rc == 0))
        return;
    errno_assert (errno == EINTR || errno == ETIMEDOUT ||
        errno == EWOULDBLOCK || errno == EINPROGRESS || errno == ECONNRESET);
}